

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnnLayer.cpp
# Opt level: O1

bool __thiscall tfs::DnnLayer::forward(DnnLayer *this)

{
  int iVar1;
  
  do {
    iVar1 = (*this->_vptr_DnnLayer[5])(this);
    if ((char)iVar1 == '\0') {
      return false;
    }
    this = this->m_next_layer;
  } while (this != (DnnLayer *)0x0);
  return true;
}

Assistant:

bool
    DnnLayer::forward( void ) {
        // -----------------------------------------------------------------------------------
        // Forward propagate while training
        // -----------------------------------------------------------------------------------
        if( !runForward()) {
            return false;
        }
        if( m_next_layer != 0 ) {
            return m_next_layer->forward();
        }
        return true;
    }